

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int line;
  uint uVar2;
  char *pcVar3;
  internal *piVar4;
  TestPartResult *this;
  ostream *poVar5;
  TimeInMillis ms;
  TestResult *result_00;
  allocator *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [8];
  string detail;
  string local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  undefined1 local_48 [8];
  string kTestcase;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  kTestcase.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"testcase",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::operator<<(stream,"    <testcase");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"name",&local_81);
  pcVar3 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_a9);
  OutputXmlAttribute(stream,(string *)local_48,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar3 = TestInfo::value_param(test_info);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"value_param",&local_d1);
    pcVar3 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,pcVar3,&local_f9);
    OutputXmlAttribute(stream,(string *)local_48,&local_d0,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  pcVar3 = TestInfo::type_param(test_info);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"type_param",&local_121);
    pcVar3 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,pcVar3,&local_149);
    OutputXmlAttribute(stream,(string *)local_48,&local_120,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"status",&local_171);
  bVar1 = TestInfo::should_run(test_info);
  pcVar3 = "notrun";
  if (bVar1) {
    pcVar3 = "run";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,pcVar3,&local_199);
  OutputXmlAttribute(stream,(string *)local_48,&local_170,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"time",&local_1c1);
  piVar4 = (internal *)TestResult::elapsed_time((TestResult *)kTestcase.field_2._8_8_);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_1e8,piVar4,ms);
  OutputXmlAttribute(stream,(string *)local_48,&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"classname",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,test_case_name,&local_231);
  OutputXmlAttribute(stream,(string *)local_48,&local_208,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  TestPropertiesAsXmlAttributes_abi_cxx11_
            ((string *)&i,(XmlUnitTestResultPrinter *)kTestcase.field_2._8_8_,result_00);
  std::operator<<(stream,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  part._4_4_ = 0;
  for (part._0_4_ = 0; line = TestResult::total_part_count((TestResult *)kTestcase.field_2._8_8_),
      (int)part < line; part._0_4_ = (int)part + 1) {
    this = TestResult::GetTestPartResult((TestResult *)kTestcase.field_2._8_8_,(int)part);
    bVar1 = TestPartResult::failed(this);
    if (bVar1) {
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        std::operator<<(stream,">\n");
      }
      piVar4 = (internal *)TestPartResult::file_name(this);
      uVar2 = TestPartResult::line_number(this);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)((long)&summary.field_2 + 8),piVar4,(char *)(ulong)uVar2,line);
      std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
      pcVar3 = TestPartResult::summary(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     &local_2c8,pcVar3);
      std::__cxx11::string::~string((string *)&local_2c8);
      in_stack_fffffffffffffb78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(stream,"      <failure message=\"");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffb70 = (allocator *)(detail.field_2._M_local_buf + 0xf);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_308,pcVar3,in_stack_fffffffffffffb70);
      EscapeXmlAttribute(&local_2e8,&local_308);
      poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffb78,(string *)&local_2e8);
      std::operator<<(poVar5,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator((allocator<char> *)(detail.field_2._M_local_buf + 0xf));
      std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
      pcVar3 = TestPartResult::message(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     &local_350,pcVar3);
      std::__cxx11::string::~string((string *)&local_350);
      RemoveInvalidXmlCharacters(&local_370,(string *)local_330);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      OutputXmlCDataSection(stream,pcVar3);
      std::__cxx11::string::~string((string *)&local_370);
      std::operator<<(stream,"</failure>\n");
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)local_2a8);
      std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
    }
  }
  if (part._4_4_ == 0) {
    std::operator<<(stream," />\n");
  }
  else {
    std::operator<<(stream,"    </testcase>\n");
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}